

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ENTITYDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::ENTITYDatatypeValidator::checkValueSpace
          (ENTITYDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  short *psVar1;
  bool bVar2;
  InvalidDatatypeValueException *this_00;
  long lVar3;
  XMLSize_t count;
  
  if (content == (XMLCh *)0x0) {
    count = 0;
  }
  else {
    lVar3 = 0;
    do {
      psVar1 = (short *)((long)content + lVar3);
      lVar3 = lVar3 + 2;
    } while (*psVar1 != 0);
    count = (lVar3 >> 1) - 1;
  }
  bVar2 = XMLChar1_0::isValidNCName(content,count);
  if (bVar2) {
    return;
  }
  this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
  InvalidDatatypeValueException::InvalidDatatypeValueException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/ENTITYDatatypeValidator.cpp"
             ,0x69,VALUE_Invalid_NCName,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
  __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
}

Assistant:

void ENTITYDatatypeValidator::checkValueSpace(const XMLCh* const content
                                              , MemoryManager* const manager)
{
    //
    // 3.3.11 check must: "NCName"
    //
    if ( !XMLChar1_0::isValidNCName(content, XMLString::stringLen(content)) )
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                , XMLExcepts::VALUE_Invalid_NCName
                , content
                , manager);
    }

}